

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::AnalyzeFeatures(IRContext *this)

{
  FeatureManager *this_00;
  pointer __p;
  __uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  local_20;
  
  this_00 = (FeatureManager *)::operator_new(0x58);
  FeatureManager::FeatureManager(this_00,&this->grammar_);
  local_20._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
       (tuple<spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>)
       (_Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        )0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           *)&this->feature_mgr_,this_00);
  std::
  unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               *)&local_20);
  FeatureManager::Analyze
            ((this->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl,
             (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  return;
}

Assistant:

void AnalyzeFeatures() {
    feature_mgr_ =
        std::unique_ptr<FeatureManager>(new FeatureManager(grammar_));
    feature_mgr_->Analyze(module());
  }